

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall
tinygltf::PerspectiveCamera::PerspectiveCamera(PerspectiveCamera *this,PerspectiveCamera *rhs)

{
  PerspectiveCamera *rhs_local;
  PerspectiveCamera *this_local;
  
  this->aspectRatio = rhs->aspectRatio;
  this->yfov = rhs->yfov;
  this->zfar = rhs->zfar;
  this->znear = rhs->znear;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions,&rhs->extensions);
  Value::Value(&this->extras,&rhs->extras);
  return;
}

Assistant:

PerspectiveCamera(PerspectiveCamera &&rhs) noexcept
      : aspectRatio(rhs.aspectRatio),
        yfov(rhs.yfov),
        zfar(rhs.zfar),
        znear(rhs.znear),
        extensions(std::move(rhs.extensions)),
        extras(std::move(rhs.extras)) {}